

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O0

void __thiscall
ExchangeCompilation_MissingDefinitions_Test::TestBody
          (ExchangeCompilation_MissingDefinitions_Test *this)

{
  bool bVar1;
  parser<pstore::exchange::import_ns::callbacks> *ppVar2;
  Message *pMVar3;
  error_code *peVar4;
  char *pcVar5;
  char *in_R9;
  error_code eVar6;
  AssertHelper local_358;
  Message local_350;
  error_code local_348;
  undefined1 local_338 [8];
  AssertionResult gtest_ar;
  parser<pstore::exchange::import_ns::callbacks> compilation_parser;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  fragment_index;
  string local_268;
  AssertHelper local_248;
  char local_23d;
  coord local_23c;
  char local_231;
  string local_230;
  Message local_210;
  bool local_201;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_;
  parser<pstore::exchange::import_ns::callbacks> name_parser;
  undefined1 local_138 [8];
  transaction<std::unique_lock<mock_mutex>_> transaction;
  undefined1 local_f8 [7];
  mock_mutex mutex;
  string_mapping imported_names;
  digest compilation_digest;
  undefined1 local_50 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> compilation;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> names;
  ExchangeCompilation_MissingDefinitions_Test *this_local;
  
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&compilation.field_2 + 8),"[ \"triple\" ]",0xc);
  s_abi_cxx11_((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               "{ \"triple\": 0 }",0xf);
  imported_names.lookup_._M_h._M_single_bucket = (__node_base_ptr)0x9abcdef0;
  pstore::exchange::import_ns::string_mapping::string_mapping((string_mapping *)local_f8);
  std::unique_lock<mock_mutex>::unique_lock
            ((unique_lock<mock_mutex> *)&name_parser.coordinate_,
             (mutex_type *)&transaction.lock_.field_0xf);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_138,
          &(this->super_ExchangeCompilation).import_db_,
          (unique_lock<mock_mutex> *)&name_parser.coordinate_);
  std::unique_lock<mock_mutex>::~unique_lock((unique_lock<mock_mutex> *)&name_parser.coordinate_);
  anon_unknown.dwarf_944bc::import_strings_parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
             (transaction *)local_138,(string_mapping *)local_f8);
  ppVar2 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                     ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_,
                      (string *)((long)&compilation.field_2 + 8));
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar2);
  local_201 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::has_error
                        ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  local_201 = !local_201;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_200,&local_201,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
  if (!bVar1) {
    testing::Message::Message(&local_210);
    pMVar3 = testing::Message::operator<<(&local_210,(char (*) [17])"JSON error was: ");
    peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    std::error_code::message_abi_cxx11_(&local_230,peVar4);
    pMVar3 = testing::Message::operator<<(pMVar3,&local_230);
    local_231 = ' ';
    pMVar3 = testing::Message::operator<<(pMVar3,&local_231);
    local_23c = pstore::json::parser<pstore::exchange::import_ns::callbacks>::coordinate
                          ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
    pMVar3 = testing::Message::operator<<(pMVar3,&local_23c);
    local_23d = '\n';
    pMVar3 = testing::Message::operator<<(pMVar3,&local_23d);
    pMVar3 = testing::Message::operator<<
                       (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)&compilation.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_268,(internal *)local_200,(AssertionResult *)"name_parser.has_error ()","true"
               ,"false",in_R9);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_248,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
               ,0x15f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_248,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_230);
    testing::Message::~Message(&local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
  if (bVar1) {
    pstore::index::
    get_index<(pstore::trailer::indices)2,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
              ((index *)&compilation_parser.coordinate_,
               &(this->super_ExchangeCompilation).import_db_,true);
    anon_unknown.dwarf_944bc::import_compilation_parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_,
               (transaction *)local_138,(string_mapping *)local_f8,
               (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                *)&compilation_parser.coordinate_,
               (digest *)&imported_names.lookup_._M_h._M_single_bucket);
    ppVar2 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::input
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_,
                        (string *)local_50);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::eof(ppVar2);
    peVar4 = pstore::json::parser<pstore::exchange::import_ns::callbacks>::last_error
                       ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_);
    eVar6 = pstore::exchange::import_ns::make_error_code(incomplete_compilation_object);
    local_348._M_cat = eVar6._M_cat;
    local_348._M_value = eVar6._M_value;
    testing::internal::EqHelper::Compare<std::error_code,_std::error_code,_nullptr>
              ((EqHelper *)local_338,"compilation_parser.last_error ()",
               "make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object)"
               ,peVar4,&local_348);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
    if (!bVar1) {
      testing::Message::Message(&local_350);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
      testing::internal::AssertHelper::AssertHelper
                (&local_358,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/exchange/test_compilation.cpp"
                 ,0x16a,pcVar5);
      testing::internal::AssertHelper::operator=(&local_358,&local_350);
      testing::internal::AssertHelper::~AssertHelper(&local_358);
      testing::Message::~Message(&local_350);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
    pstore::transaction_base::commit((transaction_base *)local_138);
    pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
              ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar.message_);
    std::
    shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
    ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                   *)&compilation_parser.coordinate_);
  }
  pstore::json::parser<pstore::exchange::import_ns::callbacks>::~parser
            ((parser<pstore::exchange::import_ns::callbacks> *)&gtest_ar_.message_);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_138);
  pstore::exchange::import_ns::string_mapping::~string_mapping((string_mapping *)local_f8);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::~string((string *)(compilation.field_2._M_local_buf + 8));
  return;
}

Assistant:

TEST_F (ExchangeCompilation, MissingDefinitions) {
    auto const names = R"([ "triple" ])"s;
    auto const compilation = R"({ "triple": 0 })"s;
    constexpr auto compilation_digest = pstore::index::digest{0x12345678, 0x9ABCDEF0};

    pstore::exchange::import_ns::string_mapping imported_names;

    mock_mutex mutex;
    auto transaction = begin (import_db_, transaction_lock{mutex});
    auto name_parser = import_strings_parser (&transaction, &imported_names);
    name_parser.input (names).eof ();
    ASSERT_FALSE (name_parser.has_error ())
        << "JSON error was: " << name_parser.last_error ().message () << ' '
        << name_parser.coordinate () << '\n'
        << names;

    auto const fragment_index =
        pstore::index::get_index<pstore::trailer::indices::fragment> (import_db_);
    auto compilation_parser = import_compilation_parser (&transaction, &imported_names,
                                                         fragment_index, compilation_digest);
    compilation_parser.input (compilation).eof ();
    EXPECT_EQ (compilation_parser.last_error (),
               make_error_code (pstore::exchange::import_ns::error::incomplete_compilation_object));

    transaction.commit ();
}